

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.c
# Opt level: O0

void file_add(char *name)

{
  int iVar1;
  file_entry_s *pfVar2;
  char *pcVar3;
  char *in_RDI;
  bool bVar4;
  file_entry_t *nf;
  char *p;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  char *local_10;
  
  pfVar2 = (file_entry_s *)mmalloc(CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
  pfVar2->next = (file_entry_s *)0x0;
  cur->next = pfVar2;
  cur = cur->next;
  strlen(in_RDI);
  pcVar3 = (char *)mmalloc(CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
  (pfVar2->file).name = pcVar3;
  strcpy((pfVar2->file).name,in_RDI);
  for (local_10 = (pfVar2->file).name; *local_10 != '\0'; local_10 = local_10 + 1) {
  }
  while( true ) {
    bVar4 = false;
    if (*local_10 != '.') {
      bVar4 = local_10 != (pfVar2->file).name;
    }
    if (!bVar4) break;
    local_10 = local_10 + -1;
  }
  iVar1 = strcmp(local_10,".c");
  if ((iVar1 == 0) || (iVar1 = strcmp(local_10,".C"), iVar1 == 0)) {
    (pfVar2->file).type = C;
  }
  else {
    iVar1 = strcmp(local_10,".i");
    if ((iVar1 == 0) || (iVar1 = strcmp(local_10,".I"), iVar1 == 0)) {
      (pfVar2->file).type = I;
    }
    else {
      iVar1 = strcmp(local_10,".s");
      if ((iVar1 == 0) || (iVar1 = strcmp(local_10,".S"), iVar1 == 0)) {
        (pfVar2->file).type = S;
      }
      else {
        (pfVar2->file).type = O;
      }
    }
  }
  (pfVar2->file).tmp = 0;
  count = count + 1;
  return;
}

Assistant:

void file_add(const char* name)
{
    char* p;
    file_entry_t* nf = (file_entry_t*)mmalloc(sizeof(file_entry_t));
    nf->next = NULL;
    cur->next = nf;
    cur = cur->next;


    nf->file.name = (char*)mmalloc(strlen(name) + 1);
    strcpy(nf->file.name, name);
    p = nf->file.name;

    /* Find the file's type using its extension */
    while (*p)
        ++p;
    while (*p != '.' && p != nf->file.name)
        --p;

    if (strcmp(p, ".c") == 0 || strcmp(p, ".C") == 0)
        nf->file.type = C;
    else if (strcmp(p, ".i") == 0 || strcmp(p, ".I") == 0)
        nf->file.type = I;
    else if (strcmp(p, ".s") == 0 || strcmp(p, ".S") == 0)
        nf->file.type = S;
    else
        nf->file.type = O;

    nf->file.tmp = 0;
    ++count;
}